

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

natwm_error monitor_setup(natwm_state *state,monitor_list **result)

{
  logger *log;
  char *pcVar1;
  monitor_list *monitor_list_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  monitor_list *monitor_list;
  list *monitors;
  server_extension *psStack_28;
  natwm_error err;
  server_extension *extension;
  monitor_list **result_local;
  natwm_state *state_local;
  
  uVar2 = 0x10bbe5;
  extension = (server_extension *)result;
  result_local = (monitor_list **)state;
  psStack_28 = server_extension_detect(state->xcb);
  if (psStack_28 == (server_extension *)0x0) {
    state_local._4_4_ = MEMORY_ALLOCATION_ERROR;
  }
  else {
    monitors._4_4_ = 0x20;
    monitor_list = (monitor_list *)0x0;
    if (psStack_28->type == RANDR) {
      monitors._4_4_ = monitors_from_randr((natwm_state *)result_local,(list **)&monitor_list);
    }
    else if (psStack_28->type == XINERAMA) {
      monitors._4_4_ = monitors_from_xinerama((natwm_state *)result_local,(list **)&monitor_list);
    }
    else {
      monitors._4_4_ = monitor_from_x((natwm_state *)result_local,(list **)&monitor_list);
    }
    log = natwm_logger;
    if (monitors._4_4_ == NO_ERROR) {
      if (monitor_list[1].extension == (server_extension *)0x0) {
        pcVar1 = server_extension_to_string(psStack_28->type);
        internal_logger(log,LEVEL_ERROR,"Failed to find a %s screen",pcVar1,in_R8,in_R9,uVar2);
        free(psStack_28);
        state_local._4_4_ = INVALID_INPUT_ERROR;
      }
      else {
        monitor_list_00 = monitor_list_create(psStack_28,(list *)monitor_list);
        if (monitor_list_00 == (monitor_list *)0x0) {
          free(psStack_28);
          list_destroy((list *)monitor_list);
          state_local._4_4_ = MEMORY_ALLOCATION_ERROR;
        }
        else {
          monitor_list_set_offsets((natwm_state *)result_local,monitor_list_00);
          ewmh_update_desktop_viewport((natwm_state *)result_local,monitor_list_00);
          *(monitor_list **)extension = monitor_list_00;
          state_local._4_4_ = NO_ERROR;
        }
      }
    }
    else {
      pcVar1 = server_extension_to_string(psStack_28->type);
      internal_logger(log,LEVEL_ERROR,"Failed to setup %s screen(s)",pcVar1,in_R8,in_R9,uVar2);
      free(psStack_28);
      state_local._4_4_ = monitors._4_4_;
    }
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error monitor_setup(const struct natwm_state *state, struct monitor_list **result)
{
        struct server_extension *extension = server_extension_detect(state->xcb);

        if (extension == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        // Resolve monitors from any extension into a linked list of generic
        // monitors.
        enum natwm_error err = GENERIC_ERROR;
        struct list *monitors = NULL;

        if (extension->type == RANDR) {
                err = monitors_from_randr(state, &monitors);
        } else if (extension->type == XINERAMA) {
                err = monitors_from_xinerama(state, &monitors);
        } else {
                err = monitor_from_x(state, &monitors);
        }

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to setup %s screen(s)",
                          server_extension_to_string(extension->type));

                free(extension);

                return err;
        }

        if (monitors->size == 0) {
                LOG_ERROR(natwm_logger,
                          "Failed to find a %s screen",
                          server_extension_to_string(extension->type));

                free(extension);

                return INVALID_INPUT_ERROR;
        }

        struct monitor_list *monitor_list = monitor_list_create(extension, monitors);

        if (monitor_list == NULL) {
                free(extension);
                list_destroy(monitors);

                return MEMORY_ALLOCATION_ERROR;
        }

        monitor_list_set_offsets(state, monitor_list);

        // Initialize the desktop viewport
        ewmh_update_desktop_viewport(state, monitor_list);

        *result = monitor_list;

        return NO_ERROR;
}